

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_im2col_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int64_t *ne,int s0,int s1,int p0,
                int p1,int d0,int d1,_Bool is_2D)

{
  ggml_tensor *tensor;
  int32_t params [7];
  
  tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,4,ne);
  params[2] = p0;
  params[3] = p1;
  params[4] = d0;
  params[5] = d1;
  params[6] = (int32_t)is_2D;
  params[0] = s0;
  params[1] = s1;
  ggml_set_op_params(tensor,params,0x1c);
  tensor->op = GGML_OP_IM2COL_BACK;
  tensor->src[0] = a;
  tensor->src[1] = b;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_im2col_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int64_t             * ne,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1,
        bool                  is_2D) {
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);
    int32_t params[] = { s0, s1, p0, p1, d0, d1, (is_2D ? 1 : 0) };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_IM2COL_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}